

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Station.cpp
# Opt level: O2

void __thiscall
imrt::Station::updateIntensity
          (Station *this,
          list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *diff)

{
  double *pdVar1;
  pair<int,_int> pVar2;
  ostream *poVar3;
  _List_node_base *p_Var4;
  int iVar5;
  long lVar6;
  double dVar7;
  
  p_Var4 = (_List_node_base *)diff;
  if ((diff->super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>).
      _M_impl._M_node._M_size != 0) {
    while (p_Var4 = (((_List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                       *)&p_Var4->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
          p_Var4 != (_List_node_base *)diff) {
      pVar2 = Collimator::indexToPos(this->collimator,*(int *)&p_Var4[1]._M_next,this->angle);
      iVar5 = pVar2.first;
      pdVar1 = (this->I).p[iVar5];
      lVar6 = (long)pVar2 >> 0x20;
      dVar7 = pdVar1[lVar6] + (double)p_Var4[1]._M_prev;
      pdVar1[lVar6] = dVar7;
      if (dVar7 < 0.0) {
        poVar3 = std::operator<<((ostream *)&std::cout,
                                 "ERROR INTENSIDAD NEGATIVA EN updateIntensity!!!!");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar5);
        poVar3 = std::operator<<(poVar3,",");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,pVar2.second);
        std::operator<<(poVar3,"-> ");
        poVar3 = std::ostream::_M_insert<double>((double)p_Var4[1]._M_prev);
        std::operator<<(poVar3," is ");
        poVar3 = std::ostream::_M_insert<double>
                           (*(this->intensity).super__Vector_base<double,_std::allocator<double>_>.
                             _M_impl.super__Vector_impl_data._M_start);
        std::operator<<(poVar3," ");
        poVar3 = std::ostream::_M_insert<double>((this->I).p[iVar5][lVar6]);
        std::endl<char,std::char_traits<char>>(poVar3);
        getchar();
      }
    }
  }
  return;
}

Assistant:

void Station::updateIntensity(list<pair<int,double> > diff) {
    pair<int,int> coord;
    if (diff.size()<1){ 
      return; 
    }
    for (auto it=diff.begin(); it!=diff.end(); it++) {
      coord = collimator.indexToPos(it->first, angle);
      I(coord.first,coord.second) = I(coord.first,coord.second) + it->second;
      if (I(coord.first,coord.second) < 0) { 
        cout <<"ERROR INTENSIDAD NEGATIVA EN updateIntensity!!!!" << coord.first<<
          ","<<coord.second << "-> "<< it->second << " is " << 
            getApertureIntensity(0) << " " << I(coord.first,coord.second)<<endl;
        getchar();
      }
    }
  }